

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt.cc
# Opt level: O2

void __thiscall re2c::Opt::reset_mapCodeName(Opt *this)

{
  (this->useropt).diverge = true;
  std::__cxx11::string::_M_assign((string *)&(this->useropt).opt.cond_get);
  (this->useropt).diverge = true;
  std::__cxx11::string::_M_assign((string *)&(this->useropt).opt.cond_set);
  (this->useropt).diverge = true;
  std::__cxx11::string::_M_assign((string *)&(this->useropt).opt.fill);
  (this->useropt).diverge = true;
  std::__cxx11::string::_M_assign((string *)&(this->useropt).opt.state_get);
  (this->useropt).diverge = true;
  std::__cxx11::string::_M_assign((string *)&(this->useropt).opt.state_set);
  (this->useropt).diverge = true;
  std::__cxx11::string::_M_assign((string *)&(this->useropt).opt.yybackup);
  (this->useropt).diverge = true;
  std::__cxx11::string::_M_assign((string *)&(this->useropt).opt.yybackupctx);
  (this->useropt).diverge = true;
  std::__cxx11::string::_M_assign((string *)&(this->useropt).opt.yycondtype);
  (this->useropt).diverge = true;
  std::__cxx11::string::_M_assign((string *)&(this->useropt).opt.yyctxmarker);
  (this->useropt).diverge = true;
  std::__cxx11::string::_M_assign((string *)&(this->useropt).opt.yyctype);
  (this->useropt).diverge = true;
  std::__cxx11::string::_M_assign((string *)&(this->useropt).opt.yycursor);
  (this->useropt).diverge = true;
  std::__cxx11::string::_M_assign((string *)&(this->useropt).opt.yydebug);
  (this->useropt).diverge = true;
  std::__cxx11::string::_M_assign((string *)&(this->useropt).opt.yylessthan);
  (this->useropt).diverge = true;
  std::__cxx11::string::_M_assign((string *)&(this->useropt).opt.yylimit);
  (this->useropt).diverge = true;
  std::__cxx11::string::_M_assign((string *)&(this->useropt).opt.yymarker);
  (this->useropt).diverge = true;
  std::__cxx11::string::_M_assign((string *)&(this->useropt).opt.yypeek);
  (this->useropt).diverge = true;
  std::__cxx11::string::_M_assign((string *)&(this->useropt).opt.yyrestore);
  (this->useropt).diverge = true;
  std::__cxx11::string::_M_assign((string *)&(this->useropt).opt.yyrestorectx);
  (this->useropt).diverge = true;
  std::__cxx11::string::_M_assign((string *)&(this->useropt).opt.yyskip);
  (this->useropt).diverge = true;
  std::__cxx11::string::_M_assign((string *)&(this->useropt).opt.yyfilllabel);
  (this->useropt).diverge = true;
  std::__cxx11::string::_M_assign((string *)&(this->useropt).opt.yynext);
  (this->useropt).diverge = true;
  std::__cxx11::string::_M_assign((string *)&(this->useropt).opt.yyaccept);
  (this->useropt).diverge = true;
  std::__cxx11::string::_M_assign((string *)&(this->useropt).opt.yybm);
  (this->useropt).diverge = true;
  std::__cxx11::string::_M_assign((string *)&(this->useropt).opt.yych);
  (this->useropt).diverge = true;
  std::__cxx11::string::_M_assign((string *)&(this->useropt).opt.yyctable);
  (this->useropt).diverge = true;
  std::__cxx11::string::_M_assign((string *)&(this->useropt).opt.yytarget);
  return;
}

Assistant:

void Opt::reset_mapCodeName ()
{
	// historically arranged set of names
	// no actual reason why these particular options should be reset
	useropt->cond_get = Opt::baseopt.cond_get;
	useropt->cond_set = Opt::baseopt.cond_set;
	useropt->fill = Opt::baseopt.fill;
	useropt->state_get = Opt::baseopt.state_get;
	useropt->state_set = Opt::baseopt.state_set;
	useropt->yybackup = Opt::baseopt.yybackup;
	useropt->yybackupctx = Opt::baseopt.yybackupctx;
	useropt->yycondtype = Opt::baseopt.yycondtype;
	useropt->yyctxmarker = Opt::baseopt.yyctxmarker;
	useropt->yyctype = Opt::baseopt.yyctype;
	useropt->yycursor = Opt::baseopt.yycursor;
	useropt->yydebug = Opt::baseopt.yydebug;
	useropt->yylessthan = Opt::baseopt.yylessthan;
	useropt->yylimit = Opt::baseopt.yylimit;
	useropt->yymarker = Opt::baseopt.yymarker;
	useropt->yypeek = Opt::baseopt.yypeek;
	useropt->yyrestore = Opt::baseopt.yyrestore;
	useropt->yyrestorectx = Opt::baseopt.yyrestorectx;
	useropt->yyskip = Opt::baseopt.yyskip;
	useropt->yyfilllabel = Opt::baseopt.yyfilllabel;
	useropt->yynext = Opt::baseopt.yynext;
	useropt->yyaccept = Opt::baseopt.yyaccept;
	useropt->yybm = Opt::baseopt.yybm;
	useropt->yych = Opt::baseopt.yych;
	useropt->yyctable = Opt::baseopt.yyctable;
	useropt->yytarget = Opt::baseopt.yytarget;
}